

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

int rb_compare_lists(lyd_node *n1,lyd_node *n2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  ly_ctx *local_60;
  ly_ctx *local_50;
  int local_44;
  int cmp;
  lyd_value *val2;
  lyd_value *val1;
  lyd_node *k2;
  lyd_node *k1;
  lyd_node *n2_local;
  lyd_node *n1_local;
  
  if ((n1->schema->nodetype & 0x10) == 0) {
    __assert_fail("n1->schema->nodetype & LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0xf2,"int rb_compare_lists(const struct lyd_node *, const struct lyd_node *)");
  }
  if ((n2->schema->nodetype & 0x10) == 0) {
    __assert_fail("n2->schema->nodetype & LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0xf3,"int rb_compare_lists(const struct lyd_node *, const struct lyd_node *)");
  }
  lVar1 = *(long *)(n1 + 1);
  lVar2 = *(long *)(n2 + 1);
  if (n1->schema == (lysc_node *)0x0) {
    local_50 = (ly_ctx *)n1[2].schema;
  }
  else {
    local_50 = n1->schema->module->ctx;
  }
  local_44 = rb_sort_clb(local_50,(lyd_value *)(lVar1 + 0x38),(lyd_value *)(lVar2 + 0x38));
  n1_local._4_4_ = local_44;
  if (local_44 == 0) {
    k2 = *(lyd_node **)(lVar1 + 0x18);
    val1 = *(lyd_value **)(lVar2 + 0x18);
    while( true ) {
      bVar4 = false;
      if ((k2 != (lyd_node *)0x0) && (bVar4 = false, k2->schema != (lysc_node *)0x0)) {
        bVar4 = (k2->schema->flags & 0x100) != 0;
      }
      if (!bVar4) break;
      if (k2->schema != (lysc_node *)val1->realtype) {
        __assert_fail("k1->schema == k2->schema",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                      ,0x103,
                      "int rb_compare_lists(const struct lyd_node *, const struct lyd_node *)");
      }
      if (n1->schema == (lysc_node *)0x0) {
        local_60 = (ly_ctx *)n1[2].schema;
      }
      else {
        local_60 = n1->schema->module->ctx;
      }
      iVar3 = rb_sort_clb(local_60,(lyd_value *)(k2 + 1),(lyd_value *)&val1[1].field_2);
      if (iVar3 != 0) {
        return iVar3;
      }
      k2 = k2->next;
      val1 = *(lyd_value **)((long)&val1->field_2 + 8);
      local_44 = 0;
    }
    n1_local._4_4_ = local_44;
  }
  return n1_local._4_4_;
}

Assistant:

static int
rb_compare_lists(const struct lyd_node *n1, const struct lyd_node *n2)
{
    const struct lyd_node *k1, *k2;
    struct lyd_value *val1, *val2;
    int cmp;

    /* compare first list key */
    assert(n1->schema->nodetype & LYS_LIST);
    assert(n2->schema->nodetype & LYS_LIST);

    /* lyd_child() is not called due to optimization */
    k1 = ((const struct lyd_node_inner *)n1)->child;
    k2 = ((const struct lyd_node_inner *)n2)->child;
    val1 = &((struct lyd_node_term *)k1)->value;
    val2 = &((struct lyd_node_term *)k2)->value;
    cmp = rb_sort_clb(LYD_CTX(n1), val1, val2);
    if (cmp != 0) {
        return cmp;
    }

    /* continue with the next keys */
    k1 = k1->next;
    k2 = k2->next;
    while (k1 && k1->schema && (k1->schema->flags & LYS_KEY)) {
        assert(k1->schema == k2->schema);
        val1 = &((struct lyd_node_term *)k1)->value;
        val2 = &((struct lyd_node_term *)k2)->value;
        cmp = rb_sort_clb(LYD_CTX(n1), val1, val2);
        if (cmp != 0) {
            return cmp;
        }
        k1 = k1->next;
        k2 = k2->next;
    }
    return cmp;
}